

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_sse2.h
# Opt level: O0

void store_8bit_4x4_sse2(__m128i s,uint8_t *d,ptrdiff_t stride)

{
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  undefined8 in_XMM0_Qa;
  ulong in_XMM0_Qb;
  __m128i ss [4];
  longlong local_68 [2];
  undefined1 local_58 [16];
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  local_58._8_8_ = in_XMM0_Qb;
  local_58._0_8_ = in_XMM0_Qa;
  local_58 = local_58 >> 0x20;
  uStack_40 = 0;
  local_38._8_8_ = 0;
  local_38._0_8_ = in_XMM0_Qb >> 0x20;
  store_8bit_4x4(&local_68,in_RDI,in_RSI);
  return;
}

Assistant:

static inline void store_8bit_4x4_sse2(const __m128i s, uint8_t *const d,
                                       const ptrdiff_t stride) {
  __m128i ss[4];

  ss[0] = s;
  ss[1] = _mm_srli_si128(s, 4);
  ss[2] = _mm_srli_si128(s, 8);
  ss[3] = _mm_srli_si128(s, 12);
  store_8bit_4x4(ss, d, stride);
}